

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

bool __thiscall
MemoryManager::setShort(MemoryManager *this,uint32_t addr,uint16_t val,uint32_t *cycles)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined2 in_DX;
  uint in_ESI;
  undefined8 in_RDI;
  undefined2 in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = isAddrExist((MemoryManager *)CONCAT44(in_ESI,CONCAT22(in_DX,in_stack_ffffffffffffffe8)),
                      (uint32_t)((ulong)in_RCX >> 0x20));
  if (bVar1) {
    setByte((MemoryManager *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
            (uint32_t)((ulong)in_RDI >> 0x20),(uint8_t)((ulong)in_RDI >> 0x18),
            (uint32_t *)CONCAT44(in_ESI,CONCAT22(in_DX,in_stack_ffffffffffffffe8)));
    setByte((MemoryManager *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
            (uint32_t)((ulong)in_RDI >> 0x20),(uint8_t)((ulong)in_RDI >> 0x18),
            (uint32_t *)CONCAT44(in_ESI,CONCAT22(in_DX,in_stack_ffffffffffffffe8)));
  }
  else {
    dbgprintf("Short write to invalid addr 0x%x!\n",(ulong)in_ESI);
  }
  return bVar1;
}

Assistant:

bool MemoryManager::setShort(uint32_t addr, uint16_t val, uint32_t *cycles) {
  if (!this->isAddrExist(addr)) {
    dbgprintf("Short write to invalid addr 0x%x!\n", addr);
    return false;
  }
  this->setByte(addr, val & 0xFF, cycles);
  this->setByte(addr + 1, (val >> 8) & 0xFF);
  return true;
}